

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUpdateHandler.cxx
# Opt level: O3

int __thiscall cmCTestUpdateHandler::DetermineType(cmCTestUpdateHandler *this,char *cmd,char *type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmCTest *pcVar2;
  size_t sVar3;
  long lVar4;
  int iVar5;
  bool bVar6;
  ostringstream cmCTestLog_msg;
  undefined1 auStack_1c8 [15];
  allocator local_1b9;
  string local_1b8;
  undefined1 local_198 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [6];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"Determine update type from command: ",0x24);
  if (cmd == (char *)0x0) {
    std::ios::clear((int)auStack_1c8 + (int)*(_func_int **)(local_198._0_8_ + -0x18) + 0x30);
  }
  else {
    sVar3 = strlen(cmd);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,cmd,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198," and type: ",0xb);
  if (type == (char *)0x0) {
    std::ios::clear((int)auStack_1c8 + (int)*(_func_int **)(local_198._0_8_ + -0x18) + 0x30);
  }
  else {
    sVar3 = strlen(type);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,type,sVar3);
  }
  std::ios::widen((char)(ostream *)local_198 + (char)*(_func_int **)(local_198._0_8_ + -0x18));
  std::ostream::put((char)local_198);
  std::ostream::flush();
  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,0,
               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
               ,0x32,local_1b8._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
  paVar1 = &local_1b8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base(local_128);
  if ((type == (char *)0x0) || (*type == '\0')) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"Type not specified, check command: ",0x23);
    if (cmd == (char *)0x0) {
      std::ios::clear((int)auStack_1c8 + (int)*(_func_int **)(local_198._0_8_ + -0x18) + 0x30);
    }
    else {
      sVar3 = strlen(cmd);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,cmd,sVar3);
    }
    std::ios::widen((char)(ostringstream *)local_198 +
                    (char)*(_func_int **)(local_198._0_8_ + -0x18));
    std::ostream::put((char)local_198);
    std::ostream::flush();
    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,0,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                 ,0x4c,local_1b8._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    std::ios_base::~ios_base(local_128);
    std::__cxx11::string::string((string *)&local_1b8,cmd,&local_1b9);
    cmsys::SystemTools::LowerCase((string *)local_198,&local_1b8);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"Type specified: ",0x10)
    ;
    sVar3 = strlen(type);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,type,sVar3);
    std::ios::widen((char)(ostream *)local_198 + (char)*(_func_int **)(local_198._0_8_ + -0x18));
    std::ostream::put((char)local_198);
    std::ostream::flush();
    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,0,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                 ,0x35,local_1b8._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    std::ios_base::~ios_base(local_128);
    local_1b8._M_dataplus._M_p = (pointer)paVar1;
    sVar3 = strlen(type);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,type,type + sVar3);
    cmsys::SystemTools::LowerCase((string *)local_198,&local_1b8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  bVar6 = false;
  lVar4 = std::__cxx11::string::find(local_198,0x630eae,0);
  if (lVar4 == -1) {
    bVar6 = false;
    lVar4 = std::__cxx11::string::find(local_198,0x631088,0);
    if (lVar4 == -1) {
      bVar6 = false;
      lVar4 = std::__cxx11::string::find(local_198,0x631093,0);
      if (lVar4 == -1) {
        bVar6 = false;
        lVar4 = std::__cxx11::string::find(local_198,0x631099,0);
        if (lVar4 == -1) {
          bVar6 = false;
          lVar4 = std::__cxx11::string::find(local_198,0x63109f,0);
          if (lVar4 == -1) {
            lVar4 = std::__cxx11::string::find(local_198,0x6310a4,0);
            bVar6 = lVar4 == -1;
            iVar5 = 6;
          }
          else {
            iVar5 = 5;
          }
        }
        else {
          iVar5 = 4;
        }
      }
      else {
        iVar5 = 3;
      }
    }
    else {
      iVar5 = 2;
    }
  }
  else {
    iVar5 = 1;
  }
  if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
    operator_delete((void *)local_198._0_8_,local_188[0]._M_allocated_capacity + 1);
  }
  if (bVar6) {
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int cmCTestUpdateHandler::DetermineType(const char* cmd, const char* type)
{
  cmCTestOptionalLog(this->CTest, DEBUG, "Determine update type from command: "
                       << cmd << " and type: " << type << std::endl,
                     this->Quiet);
  if (type && *type) {
    cmCTestOptionalLog(this->CTest, DEBUG,
                       "Type specified: " << type << std::endl, this->Quiet);
    std::string stype = cmSystemTools::LowerCase(type);
    if (stype.find("cvs") != std::string::npos) {
      return cmCTestUpdateHandler::e_CVS;
    }
    if (stype.find("svn") != std::string::npos) {
      return cmCTestUpdateHandler::e_SVN;
    }
    if (stype.find("bzr") != std::string::npos) {
      return cmCTestUpdateHandler::e_BZR;
    }
    if (stype.find("git") != std::string::npos) {
      return cmCTestUpdateHandler::e_GIT;
    }
    if (stype.find("hg") != std::string::npos) {
      return cmCTestUpdateHandler::e_HG;
    }
    if (stype.find("p4") != std::string::npos) {
      return cmCTestUpdateHandler::e_P4;
    }
  } else {
    cmCTestOptionalLog(
      this->CTest, DEBUG,
      "Type not specified, check command: " << cmd << std::endl, this->Quiet);
    std::string stype = cmSystemTools::LowerCase(cmd);
    if (stype.find("cvs") != std::string::npos) {
      return cmCTestUpdateHandler::e_CVS;
    }
    if (stype.find("svn") != std::string::npos) {
      return cmCTestUpdateHandler::e_SVN;
    }
    if (stype.find("bzr") != std::string::npos) {
      return cmCTestUpdateHandler::e_BZR;
    }
    if (stype.find("git") != std::string::npos) {
      return cmCTestUpdateHandler::e_GIT;
    }
    if (stype.find("hg") != std::string::npos) {
      return cmCTestUpdateHandler::e_HG;
    }
    if (stype.find("p4") != std::string::npos) {
      return cmCTestUpdateHandler::e_P4;
    }
  }
  return cmCTestUpdateHandler::e_UNKNOWN;
}